

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O2

int fiobj_iseq_simple(FIOBJ o,FIOBJ o2)

{
  uint uVar1;
  fiobj_object_vtable_s *pfVar2;
  size_t sVar3;
  
  if (o == o2) {
    return 1;
  }
  uVar1 = 0;
  if ((((o2 != 0 && o != 0) && ((~(uint)o2 & 6) != 0)) && (((uint)o & 6) != 6)) &&
     (((((uint)o2 | (uint)o) & 1) == 0 &&
      (*(char *)(o & 0xfffffffffffffff8) == *(char *)(o2 & 0xfffffffffffffff8))))) {
    pfVar2 = fiobj_type_vtable(o);
    sVar3 = (*pfVar2->is_eq)(o,o2);
    uVar1 = (uint)(sVar3 != 0);
  }
  return uVar1;
}

Assistant:

static inline int fiobj_iseq_simple(const FIOBJ o, const FIOBJ o2) {
  if (o == o2)
    return 1;
  if (!o || !o2)
    return 0; /* they should have compared equal before. */
  if (!FIOBJ_IS_ALLOCATED(o) || !FIOBJ_IS_ALLOCATED(o2))
    return 0; /* they should have compared equal before. */
  if (FIOBJECT2HEAD(o)->type != FIOBJECT2HEAD(o2)->type)
    return 0; /* non-type equality is a barriar to equality. */
  if (!FIOBJECT2VTBL(o)->is_eq(o, o2))
    return 0;
  return 1;
}